

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O1

void __thiscall
Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Node
          (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pNVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pNVar1 = this->left;
  if (pNVar1 != (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x40);
    this->left = (pointer)0x0;
  }
  pNVar1 = this->right;
  if (pNVar1 != (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x40);
    this->right = (pointer)0x0;
  }
  pcVar2 = (this->value)._M_dataplus._M_p;
  paVar3 = &(this->value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Node()
	{
		if(left)
		{
			delete left;
			left = nullptr;
		}

		if(right)
		{
			delete right;
			right = nullptr;
		}
	}